

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O3

void utf8_encode_char(uchar *p,int len,int c)

{
  byte bVar1;
  
  bVar1 = (byte)c;
  if (len == 2) {
    *p = (char)((uint)c >> 6) + 0xc0;
    p[1] = bVar1 & 0x3f | 0x80;
    return;
  }
  if (len != 3) {
    if (len == 4) {
      *p = (char)((uint)c >> 0x12) + 0xf0;
      p[1] = (byte)((uint)c >> 0xc) & 0x3f | 0x80;
      p[2] = (byte)((uint)c >> 6) & 0x3f | 0x80;
      p[3] = bVar1 & 0x3f | 0x80;
      return;
    }
    *p = bVar1;
    return;
  }
  *p = (char)((uint)c >> 0xc) + 0xe0;
  p[1] = (byte)((uint)c >> 6) & 0x3f | 0x80;
  p[2] = bVar1 & 0x3f | 0x80;
  return;
}

Assistant:

static void utf8_encode_char(unsigned char* p, int len, int c) {
  switch (len) {
  case 4:  *p++ = (0xF0 + ((c)>>18)); *p++ = (0x80 + ((c>>12)&0x3F));
    *p++ = (0x80 + ((c>>6)&0x3F));    *p = (0x80 + (c&0x3F)); break;
  case 3:  *p++ = (0xE0 + ((c)>>12)); *p++ = (0x80 + ((c>>6)&0x3F));
    *p = (0x80 + (c&0x3F)); break;
  case 2:  *p++ = (0xC0 + ((c)>>6));  *p = (0x80 + (c&0x3F)); break;
  default: *p = c; break;
  }
}